

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

void Abc_NtkDelayTracePrint(Abc_Ntk_t *pNtk,int fUseLutLib,int fVerbose)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  float fVar13;
  float fVar14;
  float local_40;
  
  if (fUseLutLib == 0) {
    iVar11 = Abc_NtkLevel(pNtk);
    local_40 = (float)iVar11;
  }
  else {
    pvVar5 = Abc_FrameReadLibLut();
    local_40 = 20.0;
    if (pvVar5 != (void *)0x0) {
      iVar11 = *(int *)((long)pvVar5 + 8);
      iVar3 = Abc_NtkGetFaninMax(pNtk);
      if (iVar11 < iVar3) {
        uVar10 = *(uint *)((long)pvVar5 + 8);
        uVar4 = Abc_NtkGetFaninMax(pNtk);
        printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar10,
               (ulong)uVar4);
        return;
      }
    }
  }
  fVar13 = (local_40 + 1.0) * 4.0;
  uVar6 = (ulong)fVar13;
  pvVar5 = calloc(1,(long)(fVar13 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
  fVar13 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  iVar11 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar11) {
      pcVar9 = "LUT library";
      if (fUseLutLib == 0) {
        pcVar9 = "unit-delay";
      }
      pcVar12 = "%";
      if (fUseLutLib == 0) {
        pcVar12 = "lev";
      }
      printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar13,pcVar9);
      uVar8 = 0;
      uVar6 = 5;
      uVar10 = 0;
      while ((float)(int)uVar8 < local_40) {
        uVar10 = uVar10 + *(int *)((long)pvVar5 + uVar8 * 4);
        uVar8 = uVar8 + 1;
        uVar2 = uVar6;
        if (fUseLutLib == 0) {
          uVar2 = uVar8;
        }
        printf("%3d %s : %5d  (%6.2f %%)\n",
               ((double)(int)uVar10 * 100.0) / (double)pNtk->nObjCounts[7],uVar2 & 0xffffffff,
               pcVar12,(ulong)uVar10);
        uVar6 = (ulong)((int)uVar6 + 5);
      }
      free(pvVar5);
      return;
    }
    pAVar7 = Abc_NtkObj(pNtk,iVar11);
    if (((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) &&
       ((pAVar7->vFanins).nSize != 0)) {
      fVar14 = pAVar7->pNtk->pLutTimes[(long)pAVar7->Id * 3 + 2] / (fVar13 / local_40);
      if ((fVar14 < 0.0) || (local_40 < fVar14)) {
        __assert_fail("Num >=0 && Num <= nSteps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSpeedup.c"
                      ,0x10f,"void Abc_NtkDelayTracePrint(Abc_Ntk_t *, int, int)");
      }
      piVar1 = (int *)((long)pvVar5 + (long)(int)fVar14 * 4);
      *piVar1 = *piVar1 + 1;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Abc_NtkDelayTracePrint( Abc_Ntk_t * pNtk, int fUseLutLib, int fVerbose )
{
    Abc_Obj_t * pNode;
    If_LibLut_t * pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = fUseLutLib ? 20 : Abc_NtkLevel(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Abc_ObjSlack(pNode) / tDelta;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, fUseLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", fUseLutLib? 5*(i+1) : i+1, 
            fUseLutLib? "%":"lev", Nodes, 100.0*Nodes/Abc_NtkNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}